

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_ciphersuites.c
# Opt level: O2

int * mbedtls_ssl_list_ciphersuites(void)

{
  int ciphersuite;
  mbedtls_ssl_ciphersuite_t *pmVar1;
  long lVar2;
  int *p;
  int *piVar3;
  
  if (supported_init == '\0') {
    piVar3 = ciphersuite_preference;
    lVar2 = 0;
    while ((ciphersuite = *piVar3, ciphersuite != 0 && (lVar2 < 0x230))) {
      pmVar1 = mbedtls_ssl_ciphersuite_from_id(ciphersuite);
      if ((pmVar1 != (mbedtls_ssl_ciphersuite_t *)0x0) &&
         (pmVar1->cipher != MBEDTLS_CIPHER_ARC4_128)) {
        *(int *)((long)supported_ciphersuites + lVar2) = ciphersuite;
        lVar2 = lVar2 + 4;
      }
      piVar3 = piVar3 + 1;
    }
    *(undefined4 *)((long)supported_ciphersuites + lVar2) = 0;
    supported_init = '\x01';
  }
  return supported_ciphersuites;
}

Assistant:

const int *mbedtls_ssl_list_ciphersuites( void )
{
    /*
     * On initial call filter out all ciphersuites not supported by current
     * build based on presence in the ciphersuite_definitions.
     */
    if( supported_init == 0 )
    {
        const int *p;
        int *q;

        for( p = ciphersuite_preference, q = supported_ciphersuites;
             *p != 0 && q < supported_ciphersuites + MAX_CIPHERSUITES - 1;
             p++ )
        {
#if defined(MBEDTLS_REMOVE_ARC4_CIPHERSUITES)
            const mbedtls_ssl_ciphersuite_t *cs_info;
            if( ( cs_info = mbedtls_ssl_ciphersuite_from_id( *p ) ) != NULL &&
                cs_info->cipher != MBEDTLS_CIPHER_ARC4_128 )
#else
            if( mbedtls_ssl_ciphersuite_from_id( *p ) != NULL )
#endif
                *(q++) = *p;
        }
        *q = 0;

        supported_init = 1;
    }

    return( supported_ciphersuites );
}